

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::OperatorShaderEvaluator::evaluate
          (OperatorShaderEvaluator *this,ShaderEvalContext *ctx)

{
  Vector<float,_4> VStack_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  (*this->m_evalFunc)(ctx);
  tcu::operator*((tcu *)&VStack_38,this->m_scale,&ctx->color);
  tcu::operator+((tcu *)&local_28,this->m_bias,&VStack_38);
  *(undefined8 *)(ctx->color).m_data = local_28;
  *(undefined8 *)((ctx->color).m_data + 2) = uStack_20;
  return;
}

Assistant:

virtual void evaluate (ShaderEvalContext& ctx)
	{
		m_evalFunc(ctx);
		ctx.color = ctx.color * m_scale + m_bias;
	}